

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.h
# Opt level: O0

void __thiscall FIX::DataDictionary::checkValue(DataDictionary *this,FieldBase *field)

{
  bool bVar1;
  int iVar2;
  IncorrectTagValue *this_00;
  allocator<char> local_41;
  string local_40;
  string *local_20;
  string *value;
  FieldBase *field_local;
  DataDictionary *this_local;
  
  value = (string *)field;
  field_local = (FieldBase *)this;
  iVar2 = FieldBase::getTag(field);
  bVar1 = hasFieldValue(this,iVar2);
  if (bVar1) {
    local_20 = FieldBase::getString_abi_cxx11_((FieldBase *)value);
    iVar2 = FieldBase::getTag((FieldBase *)value);
    bVar1 = isFieldValue(this,iVar2,local_20);
    if (!bVar1) {
      this_00 = (IncorrectTagValue *)__cxa_allocate_exception(0x58);
      iVar2 = FieldBase::getTag((FieldBase *)value);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
      IncorrectTagValue::IncorrectTagValue(this_00,iVar2,&local_40);
      __cxa_throw(this_00,&IncorrectTagValue::typeinfo,IncorrectTagValue::~IncorrectTagValue);
    }
  }
  return;
}

Assistant:

EXCEPT(IncorrectTagValue) {
    if (!hasFieldValue(field.getTag())) {
      return;
    }

    const std::string &value = field.getString();
    if (!isFieldValue(field.getTag(), value)) {
      throw IncorrectTagValue(field.getTag());
    }
  }